

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O2

DOMElement * __thiscall xercesc_4_0::DOMElementImpl::getNextElementSibling(DOMElementImpl *this)

{
  int iVar1;
  DOMElement *pDVar2;
  DOMElementImpl *this_00;
  
  this_00 = this;
  do {
    while( true ) {
      this = (DOMElementImpl *)getNextLogicalSibling(this_00,(DOMNode *)this);
      if (this == (DOMElementImpl *)0x0) {
        return (DOMElement *)0x0;
      }
      this_00 = this;
      iVar1 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[4])();
      if (iVar1 == 5) break;
      if (iVar1 == 1) {
        return &this->super_DOMElement;
      }
    }
    pDVar2 = getFirstElementChild(this_00,(DOMNode *)this);
  } while (pDVar2 == (DOMElement *)0x0);
  return pDVar2;
}

Assistant:

DOMElement * DOMElementImpl::getNextElementSibling() const
{
    DOMNode* n = getNextLogicalSibling(this);
    while (n != NULL) {
        switch (n->getNodeType()) {
            case DOMNode::ELEMENT_NODE:
                return (DOMElement*) n;
            case DOMNode::ENTITY_REFERENCE_NODE:
                {
                    DOMElement* e = getFirstElementChild(n);
                    if (e != NULL)
                        return e;
                }
                break;
            default:
                break;
        }
        n = getNextLogicalSibling(n);
    }
    return NULL;
}